

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AtomEscapePass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  EncodedChar *pEVar2;
  Char *pCVar3;
  code *pcVar4;
  bool bVar5;
  EncodedChar EVar6;
  undefined4 *puVar7;
  ulong uVar8;
  Node *pNVar9;
  uint uVar10;
  CharCount n;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  Char CVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  Char local_32 [4];
  Char c;
  
  if (this->inputLim <= this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar5) goto LAB_00ecdebb;
    *puVar7 = 0;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ecdebb;
    *puVar7 = 0;
  }
  pEVar2 = this->next;
  if (((ulong)(ushort)*pEVar2 < 0x100) && ((ASCIIChars::classes[(ushort)*pEVar2] & 0x10) != 0)) {
    if (this->inputLim < pEVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ecdebb;
      *puVar7 = 0;
    }
    if (*this->next != L'0') {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar13 = 4;
      iVar16 = 0;
      uVar8 = 0;
      do {
        uVar11 = uVar8;
        if (this->inputLim < (EncodedChar *)((long)this->next + lVar13 + -4)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        pEVar2 = this->next;
        uVar10 = 0;
        if ((ulong)(ushort)pEVar2[uVar11] < 0x100) {
          uVar10 = (uint)(byte)ASCIIChars::values[(ushort)pEVar2[uVar11]];
        }
        iVar16 = iVar16 * 10 + uVar10;
        if (uVar11 == 4) {
          uVar11 = 4;
          uVar8 = 5;
          break;
        }
        if (this->inputLim < (EncodedChar *)((long)pEVar2 + lVar13)) {
LAB_00ecd743:
          uVar8 = (ulong)((int)uVar11 + 1);
          break;
        }
        if (this->inputLim < (EncodedChar *)((long)pEVar2 + lVar13 + -2)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        if (0xff < (ulong)(ushort)this->next[uVar11 + 1]) goto LAB_00ecd743;
        lVar13 = lVar13 + 2;
        uVar8 = uVar11 + 1;
      } while ((ASCIIChars::classes[(ushort)this->next[uVar11 + 1]] & 0x10) != 0);
      if (iVar16 < (int)(uint)this->numGroups) {
        uVar8 = uVar8 & 0xffffffff;
        if (this->next + (uVar11 & 0xffffffff) + 2 <= this->inputLim) {
          if (this->inputLim < this->next + uVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar5) goto LAB_00ecdebb;
            *puVar7 = 0;
          }
          if (((ulong)(ushort)this->next[uVar8] < 0x100) &&
             ((ASCIIChars::classes[(ushort)this->next[uVar8]] & 0x10) != 0)) goto LAB_00ecd8cc;
        }
        if (this->inputLim < this->next + uVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        this->next = this->next + uVar8;
        pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee);
        pNVar9->tag = MatchGroup;
        pNVar9->features = 0;
        *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
        pNVar9->firstSet = (CharSet<char16_t> *)0x0;
        pNVar9->followSet = (CharSet<char16_t> *)0x0;
        (pNVar9->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
        (pNVar9->followConsumes).upper = 0xffffffff;
        pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559350;
        *(int *)&pNVar9[1]._vptr_Node = iVar16;
        *node = pNVar9;
        return false;
      }
LAB_00ecd8cc:
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ecdebb;
        *puVar7 = 0;
      }
      uVar8 = (ulong)(ushort)*this->next;
      if ((0xff < uVar8) || ((ASCIIChars::classes[uVar8] & 0x20) == 0)) {
        if (this->inputLim < this->next) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        pCVar3 = this->next;
        deferredCharNode->cs[0] = *pCVar3;
        if (this->inputLim < pCVar3 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        this->next = this->next + 1;
LAB_00ecd23b:
        *node = &deferredCharNode->super_Node;
        return false;
      }
    }
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ecdebb;
      *puVar7 = 0;
    }
    if ((0xff < (ulong)(ushort)*this->next) ||
       ((ASCIIChars::classes[(ushort)*this->next] & 0x20) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (!bVar5) {
LAB_00ecdebb:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar12 = 0;
    uVar10 = 0;
    while( true ) {
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ecdebb;
        *puVar7 = 0;
      }
      uVar8 = (ulong)(ushort)*this->next;
      uVar15 = 0;
      if (uVar8 < 0x100) {
        uVar15 = (uint)(byte)ASCIIChars::values[uVar8];
      }
      uVar15 = uVar10 * 8 + uVar15;
      if (uVar15 < 0x100) {
        if (this->inputLim < this->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ecdebb;
          *puVar7 = 0;
        }
        this->next = this->next + 1;
        uVar12 = uVar12 + 1;
        uVar10 = uVar15;
      }
      if ((0xff < uVar15) || (2 < uVar12)) break;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ecdebb;
        *puVar7 = 0;
      }
      if ((0xff < (ulong)(ushort)*this->next) ||
         ((ASCIIChars::classes[(ushort)*this->next] & 0x20) == 0)) break;
    }
    deferredCharNode->cs[0] = (Char)uVar10;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (this->inputLim < pEVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ecdebb;
    *puVar7 = 0;
  }
  pEVar2 = this->next;
  if (*pEVar2 == L'c') {
    if (this->inputLim < pEVar2 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ecdebb;
      *puVar7 = 0;
    }
    uVar8 = (ulong)(ushort)this->next[1];
    CVar14 = L'\\';
    if ((uVar8 < 0x100) && ((ASCIIChars::classes[uVar8] & 8) != 0)) {
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ecdebb;
        *puVar7 = 0;
      }
      EVar6 = this->next[1];
      if (this->inputLim < this->next + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ecdebb;
        *puVar7 = 0;
      }
      CVar14 = EVar6 & 0x1f;
      this->next = this->next + 2;
    }
    deferredCharNode->cs[0] = CVar14;
    goto LAB_00ecd23b;
  }
  if (this->inputLim <= pEVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar5) goto LAB_00ecdebb;
    *puVar7 = 0;
  }
  pCVar3 = this->next;
  this->next = pCVar3 + 1;
  CVar14 = *pCVar3;
  if ((ulong)(ushort)CVar14 < 0x100) {
    bVar5 = (bool)((ASCIIChars::classes[(ushort)CVar14] & 2) >> 1);
  }
  else {
    bVar5 = (CVar14 & 0xfffeU) == 0x2028;
  }
  if (bVar5 != false) {
    Fail(this,-0x7ff5fc0c);
  }
  local_32[0] = CVar14;
  switch(CVar14) {
  case L'S':
    EVar6 = L'S';
    goto LAB_00ecde0c;
  case L'T':
  case L'U':
  case L'V':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'`':
  case L'a':
  case L'c':
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
  case L'y':
  case L'z':
    goto switchD_00ecd5c5_caseD_54;
  case L'W':
    EVar6 = L'W';
LAB_00ecde0c:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(this,EVar6);
    goto LAB_00ecd5fb;
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'{':
  case L'|':
  case L'}':
    break;
  case L'b':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee)
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
    (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
    puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper = 0xffffffff
    ;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper = 0xffffffff
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
    (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
         (_func_int **)&PTR_LiteralLength_01558d30;
    ((MatchSetNode *)deferredCharNode)->isNegation = false;
    ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
LAB_00ecde96:
    ((MatchSetNode *)deferredCharNode)->field_0x3a = 0;
    bVar5 = true;
    goto LAB_00ecd5fe;
  case L'd':
    bVar5 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00ecd5fe;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    bVar5 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00ecd5fe;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if (((this->unicodeFlagPresent != true) ||
        (iVar16 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
        iVar16 < 1)) && (this->next + 4 <= this->inputLim)) {
      EVar6 = ECLookahead(this,0);
      if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
        EVar6 = ECLookahead(this,1);
        if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
          EVar6 = ECLookahead(this,2);
          if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
            EVar6 = ECLookahead(this,3);
            if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
              uVar10 = 0;
              EVar6 = ECLookahead(this,0);
              uVar12 = 0;
              if ((ushort)EVar6 < 0x100) {
                uVar12 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 0xc;
              }
              EVar6 = ECLookahead(this,1);
              if ((ushort)EVar6 < 0x100) {
                uVar10 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 8;
              }
              EVar6 = ECLookahead(this,2);
              uVar17 = 0;
              uVar15 = 0;
              if ((ushort)EVar6 < 0x100) {
                uVar15 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 4;
              }
              EVar6 = ECLookahead(this,3);
              if ((ushort)EVar6 < 0x100) {
                uVar17 = (uint)(byte)ASCIIChars::values[(ushort)EVar6];
              }
              local_32[0] = Chars<char16_t>::UTC(uVar10 | uVar12 | uVar15 | uVar17);
              n = 4;
              goto LAB_00ecdb6b;
            }
          }
        }
      }
    }
    break;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((this->unicodeFlagPresent == true) && (this->caseInsensitiveFlagPresent == true)) {
      StandardChars<char16_t>::SetWordIUChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00ecd5fb;
  case L'x':
    if (this->next + 2 <= this->inputLim) {
      EVar6 = ECLookahead(this,0);
      if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
        EVar6 = ECLookahead(this,1);
        if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
          uVar10 = 0;
          EVar6 = ECLookahead(this,0);
          uVar12 = 0;
          if ((ushort)EVar6 < 0x100) {
            uVar12 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 4;
          }
          EVar6 = ECLookahead(this,1);
          if ((ushort)EVar6 < 0x100) {
            uVar10 = (uint)(byte)ASCIIChars::values[(ushort)EVar6];
          }
          local_32[0] = Chars<char16_t>::UTC(uVar10 | uVar12);
          n = 2;
LAB_00ecdb6b:
          ECConsume(this,n);
        }
      }
    }
    break;
  default:
    uVar8 = (ulong)((ushort)CVar14 - 0x24);
    if ((ushort)CVar14 - 0x24 < 0x21) {
      if ((0x8000cf1UL >> (uVar8 & 0x3f) & 1) != 0) break;
      if (uVar8 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x366bee);
        (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
        (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
        puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper =
             0xffffffff;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper =
             0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
             (_func_int **)&PTR_LiteralLength_01558d30;
        ((MatchSetNode *)deferredCharNode)->isNegation = true;
        ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
        goto LAB_00ecde96;
      }
      if (uVar8 == 0x20) {
        EVar6 = L'D';
        goto LAB_00ecde0c;
      }
    }
    goto switchD_00ecd5c5_caseD_54;
  }
switchD_00ecd5c5_caseD_5b:
  deferredCharNode->cs[0] = local_32[0];
LAB_00ecd5fb:
  bVar5 = false;
LAB_00ecd5fe:
  *node = &deferredCharNode->super_Node;
  return bVar5;
switchD_00ecd5c5_caseD_54:
  if (this->unicodeFlagPresent == true) {
    Fail(this,-0x7ff5e9d6);
  }
  goto switchD_00ecd5c5_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }